

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  byte bVar1;
  IConfig *pIVar2;
  string *attribute;
  long in_RDI;
  string *in_stack_ffffffffffffff18;
  StreamingReporterBase *in_stack_ffffffffffffff20;
  string *name;
  undefined7 in_stack_ffffffffffffff30;
  string local_b0 [39];
  undefined1 local_89 [33];
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  StreamingReporterBase::testRunStarting
            (in_stack_ffffffffffffff20,(TestRunInfo *)in_stack_ffffffffffffff18);
  XmlWriter::setStream((XmlWriter *)(in_RDI + 0x1d0),*(ostream **)(in_RDI + 0x18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Catch",&local_31);
  XmlWriter::startElement((XmlWriter *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pIVar2 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)(in_RDI + 0x10));
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_68);
  bVar1 = std::__cxx11::string::empty();
  bVar1 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_68);
  if ((bVar1 & 1) != 0) {
    attribute = (string *)(in_RDI + 0x1d0);
    name = (string *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_89 + 1),"name",(allocator *)name);
    pIVar2 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)(in_RDI + 0x10));
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_b0);
    XmlWriter::writeAttribute((XmlWriter *)CONCAT17(bVar1,in_stack_ffffffffffffff30),name,attribute)
    ;
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
  }
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& testInfo ) {
            StreamingReporterBase::testRunStarting( testInfo );
            m_xml.setStream( stream );
            m_xml.startElement( "Catch" );
            if( !m_config->name().empty() )
                m_xml.writeAttribute( "name", m_config->name() );
        }